

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditPrivate::textEdited(QLineEditPrivate *this,QString *text)

{
  QLineEdit *this_00;
  Data *pDVar1;
  QObject *this_01;
  CompletionMode CVar2;
  
  this_00 = *(QLineEdit **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x27c = this->field_0x27c | 0x20;
  QLineEdit::textEdited(this_00,text);
  pDVar1 = (this->control->m_completer).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (this_01 = (this->control->m_completer).wp.value, this_01 != (QObject *)0x0)) {
    CVar2 = QCompleter::completionMode((QCompleter *)this_01);
    if (CVar2 != InlineCompletion) {
      QWidgetLineControl::complete((QWidgetLineControl *)this->control,-1);
      return;
    }
  }
  return;
}

Assistant:

void QLineEditPrivate::textEdited(const QString &text)
{
    Q_Q(QLineEdit);
    edited = true;
    emit q->textEdited(text);
#if QT_CONFIG(completer)
    if (control->completer()
        && control->completer()->completionMode() != QCompleter::InlineCompletion)
        control->complete(-1); // update the popup on cut/paste/del
#endif
}